

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  vfloat<4> vVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  vbool<4> vVar25;
  uint uVar26;
  int iVar27;
  undefined4 uVar28;
  long lVar29;
  ulong uVar30;
  NodeRef root;
  size_t sVar31;
  size_t sVar32;
  uint uVar33;
  ulong uVar34;
  NodeRef *pNVar35;
  ulong uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar115;
  float fVar116;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  float fVar121;
  undefined1 auVar122 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 in_ZMM15 [64];
  undefined1 auVar129 [64];
  Precalculations pre;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  vbool<4> terminated;
  undefined1 local_19f8 [16];
  BVH *local_19e8;
  Intersectors *local_19e0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [8];
  float fStack_1850;
  float fStack_184c;
  undefined1 local_1848 [8];
  float fStack_1840;
  float fStack_183c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_19e8 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_19e8->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar51 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar59 = vpcmpeqd_avx(auVar51,(undefined1  [16])valid_i->field_0);
    auVar52 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar52,5);
    auVar60 = auVar59 & auVar10;
    if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar60[0xf] < '\0')
    {
      auVar10 = vandps_avx(auVar10,auVar59);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar113._8_4_ = 0x7fffffff;
      auVar113._0_8_ = 0x7fffffff7fffffff;
      auVar113._12_4_ = 0x7fffffff;
      auVar59 = vandps_avx(auVar113,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar60 = vcmpps_avx(auVar59,auVar107,1);
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = 0x3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar93 = vdivps_avx(auVar118,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar59 = vandps_avx(auVar113,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar86 = vcmpps_avx(auVar59,auVar107,1);
      auVar94 = vdivps_avx(auVar118,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar59 = vandps_avx(auVar113,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar59 = vcmpps_avx(auVar59,auVar107,1);
      auVar95 = vdivps_avx(auVar118,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar108._8_4_ = 0x5d5e0b6b;
      auVar108._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar108._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar93,auVar108,auVar60);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar94,auVar108,auVar86);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar95,auVar108,auVar59);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar52,1);
      auVar93._8_4_ = 0x10;
      auVar93._0_8_ = 0x1000000010;
      auVar93._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar59,auVar93);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar52,5);
      auVar60._8_4_ = 0x20;
      auVar60._0_8_ = 0x2000000020;
      auVar60._12_4_ = 0x20;
      auVar94._8_4_ = 0x30;
      auVar94._0_8_ = 0x3000000030;
      auVar94._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar94,auVar60,auVar59);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar52,5);
      auVar86._8_4_ = 0x40;
      auVar86._0_8_ = 0x4000000040;
      auVar86._12_4_ = 0x40;
      auVar95._8_4_ = 0x50;
      auVar95._0_8_ = 0x5000000050;
      auVar95._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar95,auVar86,auVar59);
      auVar59 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar52);
      auVar60 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar52);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar119 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar59,auVar10);
      auVar59._8_4_ = 0xff800000;
      auVar59._0_8_ = 0xff800000ff800000;
      auVar59._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar59,auVar60,auVar10);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar51._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar51._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar51._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar51._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar120 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar123 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar51 = vpcmpeqd_avx(in_ZMM15._0_16_,in_ZMM15._0_16_);
      auVar129 = ZEXT1664(auVar51);
      local_19e0 = This;
LAB_019c0201:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019c0d24;
          pNVar35 = pNVar35 + -1;
          paVar37 = paVar37 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v;
          auVar63 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar51 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar26 = vmovmskps_avx(auVar51);
        } while (uVar26 == 0);
        uVar36 = (ulong)(uVar26 & 0xff);
        uVar26 = POPCOUNT(uVar26 & 0xff);
        if (uVar33 < uVar26) {
LAB_019c0241:
          do {
            vVar25.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019c0d24;
              auVar51 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar63._0_16_,6);
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar51[0xf]) goto LAB_019c0201;
              uVar36 = (ulong)((uint)root.ptr & 0xf);
              if (uVar36 == 8) goto LAB_019c0c0c;
              auVar52._0_4_ = auVar129._0_4_ ^ terminated.field_0._0_4_;
              auVar52._4_4_ = auVar129._4_4_ ^ terminated.field_0._4_4_;
              auVar52._8_4_ = auVar129._8_4_ ^ terminated.field_0._8_4_;
              auVar52._12_4_ = auVar129._12_4_ ^ terminated.field_0._12_4_;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar34 = 0;
              goto LAB_019c0434;
            }
            lVar29 = 0;
            sVar32 = 8;
            auVar51 = auVar119._0_16_;
            do {
              sVar31 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8);
              if (sVar31 == 8) {
                auVar63 = ZEXT1664(auVar51);
                sVar31 = sVar32;
                break;
              }
              uVar28 = *(undefined4 *)(root.ptr + 0x20 + lVar29 * 4);
              auVar44._4_4_ = uVar28;
              auVar44._0_4_ = uVar28;
              auVar44._8_4_ = uVar28;
              auVar44._12_4_ = uVar28;
              auVar20._8_8_ = tray.org.field_0._8_8_;
              auVar20._0_8_ = tray.org.field_0._0_8_;
              auVar21._8_8_ = tray.org.field_0._24_8_;
              auVar21._0_8_ = tray.org.field_0._16_8_;
              auVar22._8_8_ = tray.org.field_0._40_8_;
              auVar22._0_8_ = tray.org.field_0._32_8_;
              auVar59 = vsubps_avx(auVar44,auVar20);
              auVar96._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar59._0_4_;
              auVar96._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar59._4_4_;
              auVar96._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar59._8_4_;
              auVar96._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar59._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
              auVar45._4_4_ = uVar28;
              auVar45._0_4_ = uVar28;
              auVar45._8_4_ = uVar28;
              auVar45._12_4_ = uVar28;
              auVar59 = vsubps_avx(auVar45,auVar21);
              auVar103._0_4_ = tray.rdir.field_0._16_4_ * auVar59._0_4_;
              auVar103._4_4_ = tray.rdir.field_0._20_4_ * auVar59._4_4_;
              auVar103._8_4_ = tray.rdir.field_0._24_4_ * auVar59._8_4_;
              auVar103._12_4_ = tray.rdir.field_0._28_4_ * auVar59._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
              auVar46._4_4_ = uVar28;
              auVar46._0_4_ = uVar28;
              auVar46._8_4_ = uVar28;
              auVar46._12_4_ = uVar28;
              auVar59 = vsubps_avx(auVar46,auVar22);
              auVar110._0_4_ = tray.rdir.field_0._32_4_ * auVar59._0_4_;
              auVar110._4_4_ = tray.rdir.field_0._36_4_ * auVar59._4_4_;
              auVar110._8_4_ = tray.rdir.field_0._40_4_ * auVar59._8_4_;
              auVar110._12_4_ = tray.rdir.field_0._44_4_ * auVar59._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x30 + lVar29 * 4);
              auVar47._4_4_ = uVar28;
              auVar47._0_4_ = uVar28;
              auVar47._8_4_ = uVar28;
              auVar47._12_4_ = uVar28;
              auVar59 = vsubps_avx(auVar47,auVar20);
              auVar64._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar59._0_4_;
              auVar64._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar59._4_4_;
              auVar64._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar59._8_4_;
              auVar64._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar59._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x50 + lVar29 * 4);
              auVar48._4_4_ = uVar28;
              auVar48._0_4_ = uVar28;
              auVar48._8_4_ = uVar28;
              auVar48._12_4_ = uVar28;
              auVar59 = vsubps_avx(auVar48,auVar21);
              auVar75._0_4_ = tray.rdir.field_0._16_4_ * auVar59._0_4_;
              auVar75._4_4_ = tray.rdir.field_0._20_4_ * auVar59._4_4_;
              auVar75._8_4_ = tray.rdir.field_0._24_4_ * auVar59._8_4_;
              auVar75._12_4_ = tray.rdir.field_0._28_4_ * auVar59._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x70 + lVar29 * 4);
              auVar49._4_4_ = uVar28;
              auVar49._0_4_ = uVar28;
              auVar49._8_4_ = uVar28;
              auVar49._12_4_ = uVar28;
              auVar59 = vsubps_avx(auVar49,auVar22);
              auVar80._0_4_ = tray.rdir.field_0._32_4_ * auVar59._0_4_;
              auVar80._4_4_ = tray.rdir.field_0._36_4_ * auVar59._4_4_;
              auVar80._8_4_ = tray.rdir.field_0._40_4_ * auVar59._8_4_;
              auVar80._12_4_ = tray.rdir.field_0._44_4_ * auVar59._12_4_;
              auVar59 = vminps_avx(auVar96,auVar64);
              auVar60 = vminps_avx(auVar103,auVar75);
              auVar59 = vmaxps_avx(auVar59,auVar60);
              auVar60 = vminps_avx(auVar110,auVar80);
              auVar59 = vmaxps_avx(auVar59,auVar60);
              auVar50._0_4_ = auVar120._0_4_ * auVar59._0_4_;
              auVar50._4_4_ = auVar120._4_4_ * auVar59._4_4_;
              auVar50._8_4_ = auVar120._8_4_ * auVar59._8_4_;
              auVar50._12_4_ = auVar120._12_4_ * auVar59._12_4_;
              auVar59 = vmaxps_avx(auVar96,auVar64);
              auVar60 = vmaxps_avx(auVar103,auVar75);
              auVar60 = vminps_avx(auVar59,auVar60);
              auVar59 = vmaxps_avx(auVar110,auVar80);
              auVar59 = vminps_avx(auVar60,auVar59);
              auVar65._0_4_ = auVar123._0_4_ * auVar59._0_4_;
              auVar65._4_4_ = auVar123._4_4_ * auVar59._4_4_;
              auVar65._8_4_ = auVar123._8_4_ * auVar59._8_4_;
              auVar65._12_4_ = auVar123._12_4_ * auVar59._12_4_;
              auVar59 = vmaxps_avx(auVar50,(undefined1  [16])tray.tnear.field_0);
              auVar60 = vminps_avx(auVar65,(undefined1  [16])tray.tfar.field_0);
              auVar59 = vcmpps_avx(auVar59,auVar60,2);
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar59[0xf]) {
                auVar63 = ZEXT1664(auVar51);
                sVar31 = sVar32;
              }
              else {
                auVar59 = vblendvps_avx(auVar119._0_16_,auVar50,auVar59);
                auVar63 = ZEXT1664(auVar59);
                if (sVar32 != 8) {
                  pNVar35->ptr = sVar32;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar37->v = auVar51;
                  paVar37 = paVar37 + 1;
                }
              }
              lVar29 = lVar29 + 1;
              auVar51 = auVar63._0_16_;
              sVar32 = sVar31;
            } while (lVar29 != 4);
            iVar27 = 4;
            if (sVar31 == 8) goto LAB_019c03ca;
            auVar51 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar63._0_16_,6);
            uVar28 = vmovmskps_avx(auVar51);
            root.ptr = sVar31;
          } while ((byte)uVar33 < (byte)POPCOUNT(uVar28));
          pNVar35->ptr = sVar31;
          pNVar35 = pNVar35 + 1;
          *paVar37 = auVar63._0_16_;
          paVar37 = paVar37 + 1;
        }
        else {
          do {
            sVar32 = 0;
            for (uVar34 = uVar36; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              sVar32 = sVar32 + 1;
            }
            auVar129 = ZEXT1664(auVar129._0_16_);
            bVar38 = occluded1(local_19e0,local_19e8,root,sVar32,&pre,ray,&tray,context);
            if (bVar38) {
              terminated.field_0.i[sVar32] = -1;
            }
            uVar36 = uVar36 - 1 & uVar36;
          } while (uVar36 != 0);
          auVar51 = vpcmpeqd_avx(auVar129._0_16_,auVar129._0_16_);
          auVar129 = ZEXT1664(auVar51);
          auVar51 = auVar51 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar51[0xf]) {
            iVar27 = 3;
          }
          else {
            auVar51._8_4_ = 0xff800000;
            auVar51._0_8_ = 0xff800000ff800000;
            auVar51._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar51,
                               (undefined1  [16])terminated.field_0);
            iVar27 = 2;
          }
          auVar119 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar120 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar123 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar63 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar33 < uVar26) goto LAB_019c0241;
        }
LAB_019c03ca:
      } while ((iVar27 == 4) || (iVar27 == 2));
LAB_019c0d24:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar62);
      *(undefined1 (*) [16])pRVar1 = auVar10;
    }
  }
  return;
  while( true ) {
    uVar34 = uVar34 + 1;
    lVar29 = lVar29 + 0xb0;
    auVar52 = auVar59;
    if (uVar36 - 8 <= uVar34) break;
LAB_019c0434:
    uVar30 = 0;
    auVar51 = auVar52;
    while( true ) {
      uVar26 = *(uint *)(lVar29 + -0x10 + uVar30 * 4);
      if ((ulong)uVar26 == 0xffffffff) break;
      uVar28 = *(undefined4 *)(lVar29 + -0xa0 + uVar30 * 4);
      auVar39._4_4_ = uVar28;
      auVar39._0_4_ = uVar28;
      auVar39._8_4_ = uVar28;
      auVar39._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x90 + uVar30 * 4);
      auVar53._4_4_ = uVar28;
      auVar53._0_4_ = uVar28;
      auVar53._8_4_ = uVar28;
      auVar53._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x80 + uVar30 * 4);
      auVar66._4_4_ = uVar28;
      auVar66._0_4_ = uVar28;
      auVar66._8_4_ = uVar28;
      auVar66._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x70 + uVar30 * 4);
      auVar76._4_4_ = uVar28;
      auVar76._0_4_ = uVar28;
      auVar76._8_4_ = uVar28;
      auVar76._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x60 + uVar30 * 4);
      auVar81._4_4_ = uVar28;
      auVar81._0_4_ = uVar28;
      auVar81._8_4_ = uVar28;
      auVar81._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x50 + uVar30 * 4);
      auVar87._4_4_ = uVar28;
      auVar87._0_4_ = uVar28;
      auVar87._8_4_ = uVar28;
      auVar87._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x40 + uVar30 * 4);
      auVar97._4_4_ = uVar28;
      auVar97._0_4_ = uVar28;
      auVar97._8_4_ = uVar28;
      auVar97._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x30 + uVar30 * 4);
      auVar122._4_4_ = uVar28;
      auVar122._0_4_ = uVar28;
      auVar122._8_4_ = uVar28;
      auVar122._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar29 + -0x20 + uVar30 * 4);
      auVar104._4_4_ = uVar28;
      auVar104._0_4_ = uVar28;
      auVar104._8_4_ = uVar28;
      auVar104._12_4_ = uVar28;
      auVar59 = *(undefined1 (*) [16])ray;
      auVar60 = *(undefined1 (*) [16])(ray + 0x10);
      auVar86 = *(undefined1 (*) [16])(ray + 0x20);
      auVar94 = vsubps_avx(auVar39,auVar59);
      auVar95 = vsubps_avx(auVar53,auVar60);
      auVar93 = vsubps_avx(auVar66,auVar86);
      auVar107 = vsubps_avx(auVar76,auVar59);
      auVar108 = vsubps_avx(auVar81,auVar60);
      auVar118 = vsubps_avx(auVar87,auVar86);
      auVar39 = vsubps_avx(auVar97,auVar59);
      auVar41 = vsubps_avx(auVar122,auVar60);
      auVar86 = vsubps_avx(auVar104,auVar86);
      auVar53 = vsubps_avx(auVar39,auVar94);
      auVar66 = vsubps_avx(auVar41,auVar95);
      auVar76 = vsubps_avx(auVar86,auVar93);
      auVar77._0_4_ = auVar39._0_4_ + auVar94._0_4_;
      auVar77._4_4_ = auVar39._4_4_ + auVar94._4_4_;
      auVar77._8_4_ = auVar39._8_4_ + auVar94._8_4_;
      auVar77._12_4_ = auVar39._12_4_ + auVar94._12_4_;
      auVar98._0_4_ = auVar95._0_4_ + auVar41._0_4_;
      auVar98._4_4_ = auVar95._4_4_ + auVar41._4_4_;
      auVar98._8_4_ = auVar95._8_4_ + auVar41._8_4_;
      auVar98._12_4_ = auVar95._12_4_ + auVar41._12_4_;
      fVar6 = auVar93._0_4_;
      auVar105._0_4_ = auVar86._0_4_ + fVar6;
      fVar7 = auVar93._4_4_;
      auVar105._4_4_ = auVar86._4_4_ + fVar7;
      fVar8 = auVar93._8_4_;
      auVar105._8_4_ = auVar86._8_4_ + fVar8;
      fVar9 = auVar93._12_4_;
      auVar105._12_4_ = auVar86._12_4_ + fVar9;
      auVar114._0_4_ = auVar76._0_4_ * auVar98._0_4_;
      auVar114._4_4_ = auVar76._4_4_ * auVar98._4_4_;
      auVar114._8_4_ = auVar76._8_4_ * auVar98._8_4_;
      auVar114._12_4_ = auVar76._12_4_ * auVar98._12_4_;
      auVar81 = vfmsub231ps_fma(auVar114,auVar66,auVar105);
      auVar111._0_4_ = auVar105._0_4_ * auVar53._0_4_;
      auVar111._4_4_ = auVar105._4_4_ * auVar53._4_4_;
      auVar111._8_4_ = auVar105._8_4_ * auVar53._8_4_;
      auVar111._12_4_ = auVar105._12_4_ * auVar53._12_4_;
      auVar60 = vfmsub231ps_fma(auVar111,auVar76,auVar77);
      auVar78._0_4_ = auVar66._0_4_ * auVar77._0_4_;
      auVar78._4_4_ = auVar66._4_4_ * auVar77._4_4_;
      auVar78._8_4_ = auVar66._8_4_ * auVar77._8_4_;
      auVar78._12_4_ = auVar66._12_4_ * auVar77._12_4_;
      auVar59 = vfmsub231ps_fma(auVar78,auVar53,auVar98);
      fVar16 = *(float *)(ray + 0x60);
      fVar17 = *(float *)(ray + 100);
      fVar18 = *(float *)(ray + 0x68);
      auVar24 = *(undefined1 (*) [12])(ray + 0x60);
      fVar19 = *(float *)(ray + 0x6c);
      auVar79._0_4_ = fVar16 * auVar59._0_4_;
      auVar79._4_4_ = fVar17 * auVar59._4_4_;
      auVar79._8_4_ = fVar18 * auVar59._8_4_;
      auVar79._12_4_ = fVar19 * auVar59._12_4_;
      auVar59 = *(undefined1 (*) [16])(ray + 0x50);
      auVar77 = vfmadd231ps_fma(auVar79,auVar59,auVar60);
      auVar60 = *(undefined1 (*) [16])(ray + 0x40);
      auVar87 = vfmadd231ps_fma(auVar77,auVar60,auVar81);
      auVar77 = vsubps_avx(auVar95,auVar108);
      auVar81 = vsubps_avx(auVar93,auVar118);
      auVar99._0_4_ = auVar95._0_4_ + auVar108._0_4_;
      auVar99._4_4_ = auVar95._4_4_ + auVar108._4_4_;
      auVar99._8_4_ = auVar95._8_4_ + auVar108._8_4_;
      auVar99._12_4_ = auVar95._12_4_ + auVar108._12_4_;
      auVar127._0_4_ = fVar6 + auVar118._0_4_;
      auVar127._4_4_ = fVar7 + auVar118._4_4_;
      auVar127._8_4_ = fVar8 + auVar118._8_4_;
      auVar127._12_4_ = fVar9 + auVar118._12_4_;
      fVar121 = auVar81._0_4_;
      auVar88._0_4_ = fVar121 * auVar99._0_4_;
      fVar124 = auVar81._4_4_;
      auVar88._4_4_ = fVar124 * auVar99._4_4_;
      fVar125 = auVar81._8_4_;
      auVar88._8_4_ = fVar125 * auVar99._8_4_;
      fVar126 = auVar81._12_4_;
      auVar88._12_4_ = fVar126 * auVar99._12_4_;
      auVar79 = vfmsub231ps_fma(auVar88,auVar77,auVar127);
      auVar78 = vsubps_avx(auVar94,auVar107);
      fVar11 = auVar78._0_4_;
      auVar128._0_4_ = auVar127._0_4_ * fVar11;
      fVar12 = auVar78._4_4_;
      auVar128._4_4_ = auVar127._4_4_ * fVar12;
      fVar13 = auVar78._8_4_;
      auVar128._8_4_ = auVar127._8_4_ * fVar13;
      fVar14 = auVar78._12_4_;
      auVar128._12_4_ = auVar127._12_4_ * fVar14;
      auVar101._0_4_ = auVar107._0_4_ + auVar94._0_4_;
      auVar101._4_4_ = auVar107._4_4_ + auVar94._4_4_;
      auVar101._8_4_ = auVar107._8_4_ + auVar94._8_4_;
      auVar101._12_4_ = auVar107._12_4_ + auVar94._12_4_;
      auVar93 = vfmsub231ps_fma(auVar128,auVar81,auVar101);
      fVar112 = auVar77._0_4_;
      auVar102._0_4_ = fVar112 * auVar101._0_4_;
      fVar115 = auVar77._4_4_;
      auVar102._4_4_ = fVar115 * auVar101._4_4_;
      fVar116 = auVar77._8_4_;
      auVar102._8_4_ = fVar116 * auVar101._8_4_;
      fVar117 = auVar77._12_4_;
      auVar102._12_4_ = fVar117 * auVar101._12_4_;
      auVar88 = vfmsub231ps_fma(auVar102,auVar78,auVar99);
      auVar100._0_4_ = fVar16 * auVar88._0_4_;
      auVar100._4_4_ = fVar17 * auVar88._4_4_;
      auVar100._8_4_ = fVar18 * auVar88._8_4_;
      auVar100._12_4_ = fVar19 * auVar88._12_4_;
      auVar93 = vfmadd231ps_fma(auVar100,auVar59,auVar93);
      auVar88 = vfmadd231ps_fma(auVar93,auVar60,auVar79);
      auVar79 = vsubps_avx(auVar107,auVar39);
      auVar54._0_4_ = auVar107._0_4_ + auVar39._0_4_;
      auVar54._4_4_ = auVar107._4_4_ + auVar39._4_4_;
      auVar54._8_4_ = auVar107._8_4_ + auVar39._8_4_;
      auVar54._12_4_ = auVar107._12_4_ + auVar39._12_4_;
      auVar107 = vsubps_avx(auVar108,auVar41);
      auVar40._0_4_ = auVar108._0_4_ + auVar41._0_4_;
      auVar40._4_4_ = auVar108._4_4_ + auVar41._4_4_;
      auVar40._8_4_ = auVar108._8_4_ + auVar41._8_4_;
      auVar40._12_4_ = auVar108._12_4_ + auVar41._12_4_;
      auVar108 = vsubps_avx(auVar118,auVar86);
      auVar67._0_4_ = auVar118._0_4_ + auVar86._0_4_;
      auVar67._4_4_ = auVar118._4_4_ + auVar86._4_4_;
      auVar67._8_4_ = auVar118._8_4_ + auVar86._8_4_;
      auVar67._12_4_ = auVar118._12_4_ + auVar86._12_4_;
      auVar82._0_4_ = auVar108._0_4_ * auVar40._0_4_;
      auVar82._4_4_ = auVar108._4_4_ * auVar40._4_4_;
      auVar82._8_4_ = auVar108._8_4_ * auVar40._8_4_;
      auVar82._12_4_ = auVar108._12_4_ * auVar40._12_4_;
      auVar93 = vfmsub231ps_fma(auVar82,auVar107,auVar67);
      auVar68._0_4_ = auVar79._0_4_ * auVar67._0_4_;
      auVar68._4_4_ = auVar79._4_4_ * auVar67._4_4_;
      auVar68._8_4_ = auVar79._8_4_ * auVar67._8_4_;
      auVar68._12_4_ = auVar79._12_4_ * auVar67._12_4_;
      auVar86 = vfmsub231ps_fma(auVar68,auVar108,auVar54);
      auVar55._0_4_ = auVar107._0_4_ * auVar54._0_4_;
      auVar55._4_4_ = auVar107._4_4_ * auVar54._4_4_;
      auVar55._8_4_ = auVar107._8_4_ * auVar54._8_4_;
      auVar55._12_4_ = auVar107._12_4_ * auVar54._12_4_;
      auVar118 = vfmsub231ps_fma(auVar55,auVar79,auVar40);
      auVar41._0_4_ = fVar16 * auVar118._0_4_;
      auVar41._4_4_ = fVar17 * auVar118._4_4_;
      auVar41._8_4_ = fVar18 * auVar118._8_4_;
      auVar41._12_4_ = fVar19 * auVar118._12_4_;
      auVar86 = vfmadd231ps_fma(auVar41,auVar59,auVar86);
      auVar118 = vfmadd231ps_fma(auVar86,auVar60,auVar93);
      auVar89._0_4_ = auVar118._0_4_ + auVar87._0_4_ + auVar88._0_4_;
      auVar89._4_4_ = auVar118._4_4_ + auVar87._4_4_ + auVar88._4_4_;
      auVar89._8_4_ = auVar118._8_4_ + auVar87._8_4_ + auVar88._8_4_;
      auVar89._12_4_ = auVar118._12_4_ + auVar87._12_4_ + auVar88._12_4_;
      auVar86 = vandps_avx(auVar113,auVar89);
      auVar56._0_4_ = auVar86._0_4_ * 1.1920929e-07;
      auVar56._4_4_ = auVar86._4_4_ * 1.1920929e-07;
      auVar56._8_4_ = auVar86._8_4_ * 1.1920929e-07;
      auVar56._12_4_ = auVar86._12_4_ * 1.1920929e-07;
      auVar86 = vminps_avx(auVar87,auVar88);
      auVar86 = vminps_avx(auVar86,auVar118);
      uVar15 = CONCAT44(auVar56._4_4_,auVar56._0_4_);
      auVar83._0_8_ = uVar15 ^ 0x8000000080000000;
      auVar83._8_4_ = -auVar56._8_4_;
      auVar83._12_4_ = -auVar56._12_4_;
      auVar86 = vcmpps_avx(auVar86,auVar83,5);
      auVar93 = vmaxps_avx(auVar87,auVar88);
      auVar93 = vmaxps_avx(auVar93,auVar118);
      auVar93 = vcmpps_avx(auVar93,auVar56,2);
      auVar86 = vorps_avx(auVar86,auVar93);
      auVar93 = auVar51 & auVar86;
      auVar86 = vandps_avx(auVar86,auVar51);
      if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar93 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar93[0xf])
      {
        auVar59 = vpcmpeqd_avx(auVar79,auVar79);
      }
      else {
        auVar42._0_4_ = fVar112 * auVar76._0_4_;
        auVar42._4_4_ = fVar115 * auVar76._4_4_;
        auVar42._8_4_ = fVar116 * auVar76._8_4_;
        auVar42._12_4_ = fVar117 * auVar76._12_4_;
        auVar118 = vfmsub213ps_fma(auVar66,auVar81,auVar42);
        auVar69._0_4_ = auVar107._0_4_ * fVar121;
        auVar69._4_4_ = auVar107._4_4_ * fVar124;
        auVar69._8_4_ = auVar107._8_4_ * fVar125;
        auVar69._12_4_ = auVar107._12_4_ * fVar126;
        auVar84._0_4_ = fVar11 * auVar108._0_4_;
        auVar84._4_4_ = fVar12 * auVar108._4_4_;
        auVar84._8_4_ = fVar13 * auVar108._8_4_;
        auVar84._12_4_ = fVar14 * auVar108._12_4_;
        auVar39 = vfmsub213ps_fma(auVar108,auVar77,auVar69);
        auVar93 = vandps_avx(auVar113,auVar42);
        auVar108 = vandps_avx(auVar113,auVar69);
        auVar93 = vcmpps_avx(auVar93,auVar108,1);
        auVar118 = vblendvps_avx(auVar39,auVar118,auVar93);
        auVar90._0_4_ = auVar79._0_4_ * fVar112;
        auVar90._4_4_ = auVar79._4_4_ * fVar115;
        auVar90._8_4_ = auVar79._8_4_ * fVar116;
        auVar90._12_4_ = auVar79._12_4_ * fVar117;
        auVar39 = vfmsub213ps_fma(auVar79,auVar81,auVar84);
        auVar70._0_4_ = fVar121 * auVar53._0_4_;
        auVar70._4_4_ = fVar124 * auVar53._4_4_;
        auVar70._8_4_ = fVar125 * auVar53._8_4_;
        auVar70._12_4_ = fVar126 * auVar53._12_4_;
        auVar41 = vfmsub213ps_fma(auVar76,auVar78,auVar70);
        auVar93 = vandps_avx(auVar113,auVar70);
        auVar108 = vandps_avx(auVar113,auVar84);
        auVar93 = vcmpps_avx(auVar93,auVar108,1);
        auVar108 = vblendvps_avx(auVar39,auVar41,auVar93);
        auVar23._4_4_ = fVar12 * auVar66._4_4_;
        auVar23._0_4_ = fVar11 * auVar66._0_4_;
        auVar23._8_4_ = fVar13 * auVar66._8_4_;
        auVar23._12_4_ = fVar14 * auVar66._12_4_;
        auVar41 = vfmsub213ps_fma(auVar53,auVar77,auVar23);
        auVar53 = vfmsub213ps_fma(auVar107,auVar78,auVar90);
        auVar93 = vandps_avx(auVar113,auVar23);
        auVar107 = vandps_avx(auVar113,auVar90);
        auVar93 = vcmpps_avx(auVar93,auVar107,1);
        auVar93 = vblendvps_avx(auVar53,auVar41,auVar93);
        local_1a78 = auVar24._0_4_;
        fStack_1a74 = auVar24._4_4_;
        fStack_1a70 = auVar24._8_4_;
        auVar57._0_4_ = auVar93._0_4_ * local_1a78;
        auVar57._4_4_ = auVar93._4_4_ * fStack_1a74;
        auVar57._8_4_ = auVar93._8_4_ * fStack_1a70;
        auVar57._12_4_ = auVar93._12_4_ * fVar19;
        auVar59 = vfmadd213ps_fma(auVar59,auVar108,auVar57);
        auVar59 = vfmadd213ps_fma(auVar60,auVar118,auVar59);
        auVar58._0_4_ = auVar59._0_4_ + auVar59._0_4_;
        auVar58._4_4_ = auVar59._4_4_ + auVar59._4_4_;
        auVar58._8_4_ = auVar59._8_4_ + auVar59._8_4_;
        auVar58._12_4_ = auVar59._12_4_ + auVar59._12_4_;
        auVar91._0_4_ = auVar93._0_4_ * fVar6;
        auVar91._4_4_ = auVar93._4_4_ * fVar7;
        auVar91._8_4_ = auVar93._8_4_ * fVar8;
        auVar91._12_4_ = auVar93._12_4_ * fVar9;
        auVar59 = vfmadd213ps_fma(auVar95,auVar108,auVar91);
        auVar60 = vfmadd213ps_fma(auVar94,auVar118,auVar59);
        auVar59 = vrcpps_avx(auVar58);
        auVar109._8_4_ = 0x3f800000;
        auVar109._0_8_ = 0x3f8000003f800000;
        auVar109._12_4_ = 0x3f800000;
        auVar94 = vfnmadd213ps_fma(auVar59,auVar58,auVar109);
        auVar59 = vfmadd132ps_fma(auVar94,auVar59,auVar59);
        auVar92._0_4_ = auVar59._0_4_ * (auVar60._0_4_ + auVar60._0_4_);
        auVar92._4_4_ = auVar59._4_4_ * (auVar60._4_4_ + auVar60._4_4_);
        auVar92._8_4_ = auVar59._8_4_ * (auVar60._8_4_ + auVar60._8_4_);
        auVar92._12_4_ = auVar59._12_4_ * (auVar60._12_4_ + auVar60._12_4_);
        auVar59 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar92,2);
        auVar60 = vcmpps_avx(auVar92,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar59 = vandps_avx(auVar60,auVar59);
        uVar15 = CONCAT44(auVar58._4_4_,auVar58._0_4_);
        auVar106._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar106._8_4_ = -auVar58._8_4_;
        auVar106._12_4_ = -auVar58._12_4_;
        auVar60 = vcmpps_avx(auVar106,auVar58,4);
        auVar59 = vandps_avx(auVar60,auVar59);
        auVar59 = vpslld_avx(auVar59,0x1f);
        auVar60 = vpsrad_avx(auVar59,0x1f);
        auVar59 = auVar86 & auVar60;
        auVar86 = vandps_avx(auVar60,auVar86);
        if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar59[0xf] < '\0') {
          local_18a8 = auVar93;
          local_1898 = auVar108;
          local_1888 = auVar118;
          local_1878 = auVar92;
          local_1868 = auVar89;
          _local_1858 = auVar88;
          _local_1848 = auVar87;
        }
        auVar59 = vpcmpeqd_avx(auVar39,auVar39);
      }
      auVar129 = ZEXT1664(auVar59);
      auVar123 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar120 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar119 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      pGVar4 = (context->scene->geometries).items[uVar26].ptr;
      uVar2 = pGVar4->mask;
      auVar43._4_4_ = uVar2;
      auVar43._0_4_ = uVar2;
      auVar43._8_4_ = uVar2;
      auVar43._12_4_ = uVar2;
      auVar60 = vpand_avx(auVar43,*(undefined1 (*) [16])(ray + 0x90));
      auVar60 = vpcmpeqd_avx(auVar60,_DAT_01f7aa10);
      auVar93 = auVar86 & ~auVar60;
      if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar93[0xf] < '\0'
         ) {
        uVar28 = *(undefined4 *)(lVar29 + uVar30 * 4);
        auVar60 = vandnps_avx(auVar60,auVar86);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar86 = vandps_avx(auVar113,local_1868);
          auVar93 = vrcpps_avx(local_1868);
          auVar85._8_4_ = 0x3f800000;
          auVar85._0_8_ = 0x3f8000003f800000;
          auVar85._12_4_ = 0x3f800000;
          auVar94 = vfnmadd213ps_fma(auVar93,local_1868,auVar85);
          auVar93 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
          auVar71._8_4_ = 0x219392ef;
          auVar71._0_8_ = 0x219392ef219392ef;
          auVar71._12_4_ = 0x219392ef;
          auVar86 = vcmpps_avx(auVar86,auVar71,5);
          auVar86 = vandps_avx(auVar86,auVar93);
          auVar72._0_4_ = auVar86._0_4_ * (float)local_1848._0_4_;
          auVar72._4_4_ = auVar86._4_4_ * (float)local_1848._4_4_;
          auVar72._8_4_ = auVar86._8_4_ * fStack_1840;
          auVar72._12_4_ = auVar86._12_4_ * fStack_183c;
          local_1738 = vminps_avx(auVar72,auVar85);
          auVar61._0_4_ = auVar86._0_4_ * (float)local_1858._0_4_;
          auVar61._4_4_ = auVar86._4_4_ * (float)local_1858._4_4_;
          auVar61._8_4_ = auVar86._8_4_ * fStack_1850;
          auVar61._12_4_ = auVar86._12_4_ * fStack_184c;
          local_1728 = vminps_avx(auVar61,auVar85);
          local_1718._4_4_ = uVar28;
          local_1718._0_4_ = uVar28;
          local_1718._8_4_ = uVar28;
          local_1718._12_4_ = uVar28;
          local_1768 = local_1888._0_8_;
          uStack_1760 = local_1888._8_8_;
          local_1758 = local_1898._0_8_;
          uStack_1750 = local_1898._8_8_;
          local_1748 = local_18a8;
          vpcmpeqd_avx2(ZEXT1632(local_1728),ZEXT1632(local_1728));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar86 = *(undefined1 (*) [16])(ray + 0x80);
          auVar93 = vblendvps_avx(auVar86,local_1878,auVar60);
          *(undefined1 (*) [16])(ray + 0x80) = auVar93;
          args.valid = (int *)local_19f8;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_19f8 = auVar60;
          args.ray = (RTCRayN *)ray;
          local_1708 = uVar26;
          uStack_1704 = uVar26;
          uStack_1700 = uVar26;
          uStack_16fc = uVar26;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar123 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar120 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar119 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_19f8 == (undefined1  [16])0x0) {
            auVar60 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar59 = vpcmpeqd_avx(auVar59,auVar59);
            auVar129 = ZEXT1664(auVar59);
            auVar59 = auVar59 ^ auVar60;
          }
          else {
            p_Var5 = context->args->filter;
            auVar59 = vpcmpeqd_avx(auVar59,auVar59);
            auVar129 = ZEXT1664(auVar59);
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar59 = vpcmpeqd_avx(auVar59,auVar59);
              auVar129 = ZEXT1664(auVar59);
              auVar123 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar120 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar119 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar60 = vpcmpeqd_avx(local_19f8,_DAT_01f7aa10);
            auVar59 = auVar129._0_16_ ^ auVar60;
            auVar73._8_4_ = 0xff800000;
            auVar73._0_8_ = 0xff800000ff800000;
            auVar73._12_4_ = 0xff800000;
            auVar60 = vblendvps_avx(auVar73,*(undefined1 (*) [16])(args.ray + 0x80),auVar60);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar60;
          }
          auVar59 = vpslld_avx(auVar59,0x1f);
          auVar60 = vpsrad_avx(auVar59,0x1f);
          auVar59 = vblendvps_avx(auVar86,*(undefined1 (*) [16])pRVar1,auVar59);
          *(undefined1 (*) [16])pRVar1 = auVar59;
        }
        auVar51 = vpandn_avx(auVar60,auVar51);
      }
      if (((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf])
         || (bVar38 = 2 < uVar30, uVar30 = uVar30 + 1, bVar38)) break;
    }
    auVar59 = vandps_avx(auVar51,auVar52);
    auVar52 = auVar52 & auVar51;
    if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf])
    break;
  }
  terminated.field_0.i[0] = auVar129._0_4_ ^ auVar59._0_4_;
  terminated.field_0.i[1] = auVar129._4_4_ ^ auVar59._4_4_;
  terminated.field_0.i[2] = auVar129._8_4_ ^ auVar59._8_4_;
  terminated.field_0.i[3] = auVar129._12_4_ ^ auVar59._12_4_;
LAB_019c0c0c:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])vVar25.field_0,(undefined1  [16])terminated.field_0);
  auVar51 = auVar129._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf])
  goto LAB_019c0d24;
  auVar74._8_4_ = 0xff800000;
  auVar74._0_8_ = 0xff800000ff800000;
  auVar74._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar74,
                     (undefined1  [16])terminated.field_0);
  goto LAB_019c0201;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }